

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O3

cell * references::scheme::proc_head(cell *__return_storage_ptr__,cells *c)

{
  cell_type *pcVar1;
  environment *peVar2;
  
  pcVar1 = *(cell_type **)
            &(((c->
               super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
               )._M_impl.super__Vector_impl_data._M_start)->list).
             super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
             ._M_impl.super__Vector_impl_data;
  __return_storage_ptr__->type = *pcVar1;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,*(undefined8 *)(pcVar1 + 2),
             *(undefined8 *)(pcVar1 + 4) + *(undefined8 *)(pcVar1 + 2));
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::vector
            (&__return_storage_ptr__->list,
             (vector<references::scheme::cell,_std::allocator<references::scheme::cell>_> *)
             (pcVar1 + 10));
  peVar2 = *(environment **)(pcVar1 + 0x12);
  __return_storage_ptr__->proc = *(proc_type *)(pcVar1 + 0x10);
  __return_storage_ptr__->env = peVar2;
  return __return_storage_ptr__;
}

Assistant:

cell proc_head(const cells & c) { return c[0].list[0]; }